

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_handle_lifetime.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZETHandleLifetimeValidation::zetTracerExpDestroyPrologue
          (ZETHandleLifetimeValidation *this,zet_tracer_exp_handle_t hTracer)

{
  long lVar1;
  bool bVar2;
  
  lVar1 = context;
  if ((hTracer == (zet_tracer_exp_handle_t)0x0) ||
     (bVar2 = HandleLifetimeValidation::isHandleValid
                        (*(HandleLifetimeValidation **)(context + 0xd48),hTracer), !bVar2)) {
    bVar2 = HandleLifetimeValidation::isHandleValid
                      (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hTracer);
    if (!bVar2) {
      return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
    }
  }
  else {
    bVar2 = HandleLifetimeValidation::hasDependents
                      (*(HandleLifetimeValidation **)(lVar1 + 0xd48),hTracer);
    if (bVar2) {
      return ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
    }
    HandleLifetimeValidation::removeDependent(*(HandleLifetimeValidation **)(lVar1 + 0xd48),hTracer)
    ;
    HandleLifetimeValidation::removeHandle(*(HandleLifetimeValidation **)(lVar1 + 0xd48),hTracer);
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

ze_result_t
    ZETHandleLifetimeValidation::zetTracerExpDestroyPrologue(
        zet_tracer_exp_handle_t hTracer                 ///< [in][release] handle of tracer object to destroy
        )
    { 
        
        if (hTracer && context.handleLifetime->isHandleValid( hTracer )){
            if (context.handleLifetime->hasDependents( hTracer )){
                return ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE;
            }
            context.handleLifetime->removeDependent( hTracer);
            context.handleLifetime->removeHandle( hTracer );
        } else if (!context.handleLifetime->isHandleValid( hTracer )) {
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
        }
        return ZE_RESULT_SUCCESS;
    }